

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemFrontend.cpp
# Opt level: O3

void __thiscall
llbuild::buildsystem::BuildSystemFrontendDelegate::~BuildSystemFrontendDelegate
          (BuildSystemFrontendDelegate *this)

{
  void *pvVar1;
  
  (this->super_BuildSystemDelegate)._vptr_BuildSystemDelegate =
       (_func_int **)&PTR__BuildSystemFrontendDelegate_0023c8b0;
  pvVar1 = this->impl;
  if (pvVar1 != (void *)0x0) {
    llvm::
    DenseMapBase<llvm::DenseMap<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::destroyAll((DenseMapBase<llvm::DenseMap<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)((long)pvVar1 + 0x38));
    operator_delete(*(void **)((long)pvVar1 + 0x38));
    llbuild::basic::ExecutionQueueDelegate::~ExecutionQueueDelegate
              ((ExecutionQueueDelegate *)((long)pvVar1 + 0x20));
  }
  operator_delete(pvVar1,0x78);
  BuildSystemDelegate::~BuildSystemDelegate(&this->super_BuildSystemDelegate);
  return;
}

Assistant:

BuildSystemFrontendDelegate::~BuildSystemFrontendDelegate() {
  delete static_cast<BuildSystemFrontendDelegateImpl*>(this->impl);
}